

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.hpp
# Opt level: O0

void * Platform::safeRealloc(void *p,size_t size)

{
  void *other;
  size_t size_local;
  void *p_local;
  
  if ((p == (void *)0x0) && (size == 0)) {
    p_local = (void *)0x0;
  }
  else if (size == 0) {
    free(p);
    p_local = (void *)0x0;
  }
  else {
    p_local = realloc(p,size);
    if ((size != 0) && (p_local == (void *)0x0)) {
      free(p);
    }
  }
  return p_local;
}

Assistant:

inline void * safeRealloc(void * p, size_t size) 
    {
        if (p == 0 && size == 0) return 0;
        if (size == 0)
        {
            free(p);
            return 0; // On FreeBSD realloc(ptr, 0) frees ptr BUT allocates a 0 sized buffer.
        }
        void * other = realloc(p, size);
        if (size && other == NULL)
            free(p); // Reallocation fails, let's free the previous pointer

        return other;
    }